

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

string * __thiscall
ftxui::Color::Print_abi_cxx11_(string *__return_storage_ptr__,Color *this,bool is_background_color)

{
  char *pcVar1;
  string *this_00;
  string local_100;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  switch(this->type_) {
  case Palette1:
    pcVar1 = "39";
    if (is_background_color) {
      pcVar1 = "49";
    }
    break;
  case Palette16:
    pcVar1 = *(char **)((anonymous_namespace)::palette16code +
                       (ulong)is_background_color * 8 + (ulong)(this->field_1).index_ * 0x10);
    break;
  case Palette256:
    pcVar1 = "38;5;";
    if (is_background_color) {
      pcVar1 = "48;5;";
    }
    std::__cxx11::to_string(&local_100,(uint)(this->field_1).index_);
    std::operator+(__return_storage_ptr__,pcVar1,&local_100);
    this_00 = &local_100;
    goto LAB_001443fd;
  case TrueColor:
    pcVar1 = "38;2;";
    if (is_background_color) {
      pcVar1 = "48;2;";
    }
    std::__cxx11::to_string(&local_40,(uint)(this->field_1).index_);
    std::operator+(&local_a0,pcVar1,&local_40);
    std::operator+(&local_80,&local_a0,";");
    std::__cxx11::to_string(&local_c0,(uint)this->green_);
    std::operator+(&local_60,&local_80,&local_c0);
    std::operator+(&local_100,&local_60,";");
    std::__cxx11::to_string(&local_e0,(uint)this->blue_);
    std::operator+(__return_storage_ptr__,&local_100,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    this_00 = &local_40;
LAB_001443fd:
    std::__cxx11::string::~string((string *)this_00);
    return __return_storage_ptr__;
  default:
    pcVar1 = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar1,(allocator<char> *)&local_100);
  return __return_storage_ptr__;
}

Assistant:

std::string Color::Print(bool is_background_color) const {
  switch (type_) {
    case ColorType::Palette1:
      return is_background_color ? "49" : "39";

    case ColorType::Palette16:
      return palette16code[index_][is_background_color];

    case ColorType::Palette256:
      return (is_background_color ? "48;5;" : "38;5;") + std::to_string(index_);

    case ColorType::TrueColor:
      return (is_background_color ? "48;2;" : "38;2;")  //
             + std::to_string(red_) + ";"               //
             + std::to_string(green_) + ";"             //
             + std::to_string(blue_);                   //
  }
  return "";
}